

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O1

string * __thiscall
NullBackendFactory::probe_abi_cxx11_
          (string *__return_storage_ptr__,NullBackendFactory *this,BackendType type)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (type == Playback) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,0x192b83);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NullBackendFactory::probe(BackendType type)
{
    std::string outnames;
    switch(type)
    {
    case BackendType::Playback:
        /* Includes null char. */
        outnames.append(nullDevice, sizeof(nullDevice));
        break;
    case BackendType::Capture:
        break;
    }
    return outnames;
}